

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::Func::~Func(Func *this)

{
  Expr *pEVar1;
  pointer ppVar2;
  pointer pTVar3;
  pointer pcVar4;
  _func_int ***ppp_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  
  pEVar1 = (this->exprs).first_;
  while (pEVar1 != (Expr *)0x0) {
    ppp_Var5 = &pEVar1->_vptr_Expr;
    pEVar1 = (pEVar1->super_intrusive_list_base<wabt::Expr>).next_;
    (*(*ppp_Var5)[1])();
  }
  (this->exprs).first_ = (Expr *)0x0;
  (this->exprs).last_ = (Expr *)0x0;
  (this->exprs).size_ = 0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 *)&this->bindings);
  ppVar2 = (this->local_types).decls_.
           super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (pointer)0x0) {
    operator_delete(ppVar2,(long)(this->local_types).decls_.
                                 super__Vector_base<std::pair<wabt::Type,_unsigned_int>,_std::allocator<std::pair<wabt::Type,_unsigned_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar2);
  }
  pTVar3 = (this->decl).sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)(this->decl).sig.result_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pTVar3);
  }
  pTVar3 = (this->decl).sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pTVar3 != (pointer)0x0) {
    operator_delete(pTVar3,(long)(this->decl).sig.param_types.
                                 super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)pTVar3);
  }
  Var::~Var(&(this->decl).type_var);
  pcVar4 = (this->name)._M_dataplus._M_p;
  paVar6 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar6) {
    return;
  }
  operator_delete(pcVar4,paVar6->_M_allocated_capacity + 1);
  return;
}

Assistant:

explicit Func(std::string_view name) : name(name) {}